

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolarizableAdapter.cpp
# Opt level: O2

PolarizableAtypeParameters __thiscall
OpenMD::PolarizableAdapter::getPolarizableParam(PolarizableAdapter *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_> polData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::GenericData> local_60;
  undefined1 local_50 [16];
  string local_40;
  
  bVar2 = isPolarizable(this);
  if (!bVar2) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "PolarizableAdapter::getPolarizableParam was passed an atomType (%s)\n\tthat does not appear to be a polarizable atom.\n"
             ,local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_50,(string *)this->at_);
  if ((_func_int **)local_50._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "PolarizableAdapter::getPolarizableParam could not find polarizable\n\tparameters for atomType %s.\n"
             ,local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  std::
  dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>,OpenMD::GenericData>
            (&local_60);
  if (local_60.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    AtomType::getName_abi_cxx11_(&local_40,this->at_);
    snprintf(painCave.errMsg,2000,
             "PolarizableAdapter::getPolarizableParam could not convert\n\tGenericData to PolarizableAtypeData for atom type %s\n"
             ,local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  pp_Var1 = local_60.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            _vptr_GenericData;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  return (PolarizableAtypeParameters)(RealType)pp_Var1;
}

Assistant:

PolarizableAtypeParameters PolarizableAdapter::getPolarizableParam() {
    if (!isPolarizable()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PolarizableAdapter::getPolarizableParam was passed an atomType "
               "(%s)\n"
               "\tthat does not appear to be a polarizable atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(PolTypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "PolarizableAdapter::getPolarizableParam could not find polarizable\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<PolarizableAtypeData> polData =
        std::dynamic_pointer_cast<PolarizableAtypeData>(data);
    if (polData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PolarizableAdapter::getPolarizableParam could not convert\n"
               "\tGenericData to PolarizableAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return polData->getData();
  }